

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Writer.cpp
# Opt level: O0

void __thiscall Writer::unionDefinition(Writer *this,Program *param_2,UnionType *strct)

{
  bool bVar1;
  long in_RDX;
  StrRef in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  Type **ty;
  pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pair;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  StrRef in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff68;
  CWriter *in_stack_ffffffffffffff70;
  string local_88 [32];
  string local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  reference local_40;
  reference local_38;
  pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_30;
  __normal_iterator<const_std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_28;
  long local_20;
  long local_18;
  
  local_18 = in_RDX;
  CWriter::startUnion((CWriter *)in_RDI,in_stack_ffffffffffffff58);
  local_20 = local_18 + 0x30;
  local_28._M_current =
       (pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)std::
          vector<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::begin((vector<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffff58);
  local_30 = (pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)std::
                vector<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::end((vector<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_ffffffffffffff58);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)in_stack_ffffffffffffff58);
    if (!bVar1) break;
    local_40 = __gnu_cxx::
               __normal_iterator<const_std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator*(&local_28);
    local_48 = &local_40->second;
    in_stack_ffffffffffffff58 = in_RDI;
    local_38 = local_40;
    CWriter::indent(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    in_RDI = in_stack_ffffffffffffff58;
    (*local_40->first->_vptr_Type[3])(local_68);
    (*local_40->first->_vptr_Type[4])(local_88,local_40->first,local_48);
    CWriter::structItem((CWriter *)in_RDI,in_stack_ffffffffffffff58,(StrRef)0x2ab90b);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_68);
    __gnu_cxx::
    __normal_iterator<const_std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&local_28);
  }
  CWriter::endStruct((CWriter *)0x2ab971);
  return;
}

Assistant:

void Writer::unionDefinition(const Program& /*program*/, const UnionType* strct) {
    wr.startUnion(strct->name);

    for (const auto& pair : strct->items) {
        const auto& ty = pair.first;
        const auto& name = pair.second;
        wr.indent(1);
        wr.structItem(ty->toString(), ty->surroundName(name));
    }

    wr.endStruct();
}